

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O2

void new_pool_label(TCGContext_conflict9 *s,tcg_target_ulong d,int rtype,tcg_insn_unit *label,
                   intptr_t addend)

{
  TCGLabelPoolData *pTVar1;
  int iVar2;
  TCGLabelPoolData *pTVar3;
  undefined4 in_register_00000014;
  TCGLabelPoolData *pTVar4;
  
  pTVar3 = (TCGLabelPoolData *)tcg_malloc(s,0x28);
  pTVar3->label = (tcg_insn_unit *)CONCAT44(in_register_00000014,rtype);
  pTVar3->addend = -4;
  pTVar3->rtype = 2;
  pTVar3->nlong = 1;
  pTVar3[1].next = (TCGLabelPoolData *)d;
  pTVar1 = (TCGLabelPoolData *)&s->pool_labels;
  do {
    while( true ) {
      pTVar4 = pTVar1;
      pTVar1 = pTVar4->next;
      if (pTVar1 == (TCGLabelPoolData *)0x0) goto LAB_00b26963;
      if (pTVar1->nlong == 1) break;
      if (pTVar1->nlong == 0) goto LAB_00b26963;
    }
    iVar2 = memcmp(pTVar3 + 1,pTVar1 + 1,8);
  } while (iVar2 < 0);
LAB_00b26963:
  pTVar3->next = pTVar1;
  pTVar4->next = pTVar3;
  return;
}

Assistant:

static inline void new_pool_label(TCGContext *s, tcg_target_ulong d, int rtype,
                                  tcg_insn_unit *label, intptr_t addend)
{
    TCGLabelPoolData *n = new_pool_alloc(s, 1, rtype, label, addend);
    n->data[0] = d;
    new_pool_insert(s, n);
}